

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interp.cc
# Opt level: O2

Result ParseWasmValue(string *argument,Value *val)

{
  char *__s1;
  int iVar1;
  Result RVar2;
  u64 in_RAX;
  long lVar3;
  Enum EVar4;
  char *s;
  char *end;
  uint32_t parsed_value;
  
  EVar4 = Error;
  if (argument->_M_string_length != 0) {
    _parsed_value = in_RAX;
    lVar3 = std::__cxx11::string::find((char)argument,0x3a);
    if (lVar3 != -1) {
      (argument->_M_dataplus)._M_p[lVar3] = '\0';
      __s1 = (argument->_M_dataplus)._M_p;
      s = __s1 + lVar3 + 1;
      end = __s1 + argument->_M_string_length;
      iVar1 = strcmp(__s1,"i32");
      EVar4 = Ok;
      if (iVar1 == 0) {
        RVar2 = wabt::ParseInt32(s,end,&parsed_value,UnsignedOnly);
        EVar4 = (Enum)(RVar2.enum_ == Error);
        (val->field_0).i32_ = parsed_value;
      }
      iVar1 = strcmp(__s1,"i64");
      if (iVar1 == 0) {
        RVar2 = wabt::ParseInt64(s,end,(uint64_t *)&parsed_value,UnsignedOnly);
        EVar4 = (Enum)(byte)(RVar2.enum_ == Error | (byte)EVar4);
        (val->field_0).i64_ = _parsed_value;
      }
      iVar1 = strcmp(__s1,"f32");
      if (iVar1 == 0) {
        RVar2 = wabt::ParseFloat(Float,s,end,&parsed_value);
        EVar4 = (Enum)(byte)(RVar2.enum_ == Error | (byte)EVar4);
        (val->field_0).i32_ = parsed_value;
      }
      iVar1 = strcmp(__s1,"f64");
      if (iVar1 == 0) {
        RVar2 = wabt::ParseDouble(Float,s,end,(uint64_t *)&parsed_value);
        EVar4 = (Enum)(byte)(RVar2.enum_ == Error | (byte)EVar4);
        (val->field_0).i64_ = _parsed_value;
      }
    }
  }
  return (Result)EVar4;
}

Assistant:

Result ParseWasmValue(std::string argument, Value& val) {
  Result result = Result::Ok;

  size_t cindex;
  if (argument.empty() || (cindex = argument.find(':')) == std::string::npos) {
    return wabt::Result::Error;
  }

  argument[cindex] = '\0';
  const char* ptype = argument.c_str();
  const char* pval = argument.c_str() + cindex + 1;
  const char* pval_end = ptype + argument.length();

  if (strcmp(ptype, "i32") == 0) {
    uint32_t parsed_value;
    result |=
        ParseInt32(pval, pval_end, &parsed_value, ParseIntType::UnsignedOnly);
    val.Set(parsed_value);
  }
  if (strcmp(ptype, "i64") == 0) {
    uint64_t parsed_value;
    result |=
        ParseInt64(pval, pval_end, &parsed_value, ParseIntType::UnsignedOnly);
    val.Set(parsed_value);
  }
  if (strcmp(ptype, "f32") == 0) {
    uint32_t parsed_value;
    result |= ParseFloat(LiteralType::Float, pval, pval_end, &parsed_value);
    val.Set(parsed_value);
  }
  if (strcmp(ptype, "f64") == 0) {
    uint64_t parsed_value;
    result |= ParseDouble(LiteralType::Float, pval, pval_end, &parsed_value);
    val.Set(parsed_value);
  }
  return result;
}